

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool ftxui::IsControl(uint32_t ucs)

{
  uint32_t LINE_FEED;
  uint32_t ucs_local;
  
  if (ucs == 0) {
    LINE_FEED._3_1_ = true;
  }
  else if (ucs < 0x20) {
    LINE_FEED._3_1_ = ucs != 10;
  }
  else if ((ucs < 0x7f) || (0x9f < ucs)) {
    LINE_FEED._3_1_ = false;
  }
  else {
    LINE_FEED._3_1_ = true;
  }
  return LINE_FEED._3_1_;
}

Assistant:

bool IsControl(uint32_t ucs) {
  if (ucs == 0) {
    return true;
  }
  if (ucs < 32) {  // NOLINT
    const uint32_t LINE_FEED = 10;
    return ucs != LINE_FEED;
  }
  if (ucs >= 0x7f && ucs < 0xa0) {  // NOLINT
    return true;
  }
  return false;
}